

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O0

void __thiscall TPZMGAnalysis::SolveInternal<double>(TPZMGAnalysis *this)

{
  int64_t iVar1;
  TPZMatrixSolver<double> **ppTVar2;
  TPZMatrix<double> *pTVar3;
  TPZFMatrix<double> *pTVar4;
  ostream *poVar5;
  void *pvVar6;
  int64_t iVar7;
  TPZStepSolver<double> *this_00;
  ostream *this_01;
  TPZCompMesh *this_02;
  TPZSolutionMatrix *pTVar8;
  TPZStack<TPZSolutionMatrix_*,_10> *this_03;
  TPZSolutionMatrix *pTVar9;
  long in_RDI;
  STATE SVar10;
  double dVar11;
  TPZFMatrix<double> *pTVar12;
  int nsol_2;
  TPZFMatrix<double> *mysol;
  TPZStepSolver<double> *stepsolve;
  int nsol_1;
  REAL normres;
  REAL normrhs;
  TPZMatrixSolver<double> *solve;
  TPZFMatrix<double> delu;
  TPZFMatrix<double> residual;
  int nsolvers;
  int numeq;
  int nsol;
  TPZSolutionMatrix *in_stack_fffffffffffffd58;
  TPZLinearAnalysis *in_stack_fffffffffffffd60;
  TPZSolutionMatrix *in_stack_fffffffffffffd68;
  TPZStack<TPZMatrixSolver<double>_*,_10> *in_stack_fffffffffffffd70;
  TPZSolutionMatrix *in_stack_fffffffffffffd78;
  TPZSolutionMatrix *in_stack_fffffffffffffd80;
  TPZSolutionMatrix *in_stack_fffffffffffffd88;
  TPZCompMesh *in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffda8;
  TPZFMatrix<double> *in_stack_fffffffffffffdb0;
  int64_t in_stack_fffffffffffffdb8;
  TPZFMatrix<double> *in_stack_fffffffffffffdc0;
  TPZAutoPointer<TPZMatrix<double>_> local_158;
  TPZMatrixSolver<double> *local_150;
  undefined8 local_148;
  undefined1 local_140 [144];
  undefined1 local_b0 [144];
  int local_20;
  int local_1c;
  int local_18;
  
  iVar1 = TPZVec<TPZCompMesh_*>::NElements((TPZVec<TPZCompMesh_*> *)(in_RDI + 0x488));
  if (iVar1 == 1) {
    TPZLinearAnalysis::Solve(in_stack_fffffffffffffd60);
    iVar1 = TPZVec<TPZMatrixSolver<double>_*>::NElements
                      ((TPZVec<TPZMatrixSolver<double>_*> *)(in_RDI + 0x568));
    if (iVar1 == 0) {
      (**(code **)(**(long **)(in_RDI + 0x170) + 0x48))();
      TPZStack<TPZMatrixSolver<double>_*,_10>::Push
                (in_stack_fffffffffffffd70,(TPZMatrixSolver<double> *)in_stack_fffffffffffffd68);
    }
    iVar1 = TPZVec<TPZMatrixSolver<double>_*>::NElements
                      ((TPZVec<TPZMatrixSolver<double>_*> *)(in_RDI + 0x5d8));
    if (iVar1 == 0) {
      TPZStack<TPZMatrixSolver<double>_*,_10>::Push
                (in_stack_fffffffffffffd70,(TPZMatrixSolver<double> *)in_stack_fffffffffffffd68);
    }
    iVar1 = TPZVec<TPZSolutionMatrix_*>::NElements((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8));
    if (iVar1 == 0) {
      operator_new(0x138);
      TPZSolutionMatrix::TPZSolutionMatrix(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      TPZStack<TPZSolutionMatrix_*,_10>::Push
                ((TPZStack<TPZSolutionMatrix_*,_10> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
    }
    else {
      iVar1 = TPZVec<TPZSolutionMatrix_*>::NElements
                        ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8));
      local_18 = (int)iVar1;
      TPZVec<TPZSolutionMatrix_*>::operator[]
                ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8),(long)(local_18 + -1));
      TPZSolutionMatrix::operator=
                (in_stack_fffffffffffffd68,(TPZSolutionMatrix *)in_stack_fffffffffffffd60);
    }
  }
  else {
    iVar1 = TPZCompMesh::NEquations(in_stack_fffffffffffffd90);
    local_1c = (int)iVar1;
    iVar1 = TPZSolutionMatrix::Rows((TPZSolutionMatrix *)0x1c585f5);
    if (iVar1 == local_1c) {
      iVar1 = TPZVec<TPZMatrixSolver<double>_*>::NElements
                        ((TPZVec<TPZMatrixSolver<double>_*> *)(in_RDI + 0x568));
      local_20 = (int)iVar1;
      TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                ((TPZSolutionMatrix *)in_stack_fffffffffffffd60);
      TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_148 = 0;
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (int64_t)in_stack_fffffffffffffdb0,(double *)in_stack_fffffffffffffda8);
      ppTVar2 = TPZVec<TPZMatrixSolver<double>_*>::operator[]
                          ((TPZVec<TPZMatrixSolver<double>_*> *)(in_RDI + 0x568),
                           (long)(local_20 + -1));
      local_150 = *ppTVar2;
      iVar1 = TPZSolutionMatrix::Rows((TPZSolutionMatrix *)0x1c586b2);
      if (iVar1 == local_1c) {
        TPZMatrixSolver<double>::Matrix((TPZMatrixSolver<double> *)in_stack_fffffffffffffd58);
        pTVar3 = TPZAutoPointer<TPZMatrix<double>_>::operator->(&local_158);
        pTVar12 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                            ((TPZSolutionMatrix *)in_stack_fffffffffffffd60);
        pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                           ((TPZSolutionMatrix *)in_stack_fffffffffffffd60);
        (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
                  (pTVar3,pTVar12,pTVar4,local_b0);
        TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffd60);
      }
      else {
        TPZSolutionMatrix::Redim
                  (in_stack_fffffffffffffd68,(int64_t)in_stack_fffffffffffffd60,
                   (int64_t)in_stack_fffffffffffffd58);
      }
      SVar10 = ::Norm(in_stack_fffffffffffffd58);
      dVar11 = ::Norm((TPZFMatrix<double> *)0x1c58830);
      if (SVar10 * 1e-06 < dVar11) {
        if (local_150 == (TPZMatrixSolver<double> *)0x0) {
          this_00 = (TPZStepSolver<double> *)0x0;
        }
        else {
          this_00 = (TPZStepSolver<double> *)
                    __dynamic_cast(local_150,&TPZMatrixSolver<double>::typeinfo,
                                   &TPZStepSolver<double>::typeinfo,0);
        }
        if (this_00 != (TPZStepSolver<double> *)0x0) {
          TPZStepSolver<double>::SetTolerance(this_00,(SVar10 * 1e-06) / dVar11);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"TPZMGAnalysis::Run res : ");
        pTVar12 = (TPZFMatrix<double> *)::Norm((TPZFMatrix<double> *)0x1c58aff);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)pTVar12);
        this_01 = std::operator<<(poVar5," neq ");
        pvVar6 = (void *)std::ostream::operator<<(this_01,local_1c);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        (*(local_150->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
                  (local_150,local_b0,local_140,0);
        this_02 = (TPZCompMesh *)
                  TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                            ((TPZSolutionMatrix *)in_stack_fffffffffffffd60);
        TPZFMatrix<double>::operator+=(pTVar12,(TPZMatrix<double> *)poVar5);
        TPZCompMesh::LoadSolution(this_02,in_stack_fffffffffffffd88);
        pTVar8 = (TPZSolutionMatrix *)
                 TPZVec<TPZSolutionMatrix_*>::NElements
                           ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8));
        iVar1 = TPZVec<TPZCompMesh_*>::NElements((TPZVec<TPZCompMesh_*> *)(in_RDI + 0x488));
        if ((long)pTVar8 < iVar1) {
          this_03 = (TPZStack<TPZSolutionMatrix_*,_10> *)(in_RDI + 0x4f8);
          pTVar9 = (TPZSolutionMatrix *)operator_new(0x138);
          TPZSolutionMatrix::TPZSolutionMatrix(pTVar8,pTVar9);
          TPZStack<TPZSolutionMatrix_*,_10>::Push(this_03,in_stack_fffffffffffffd68);
        }
        else {
          pTVar9 = (TPZSolutionMatrix *)(in_RDI + 0x4f8);
          iVar1 = TPZVec<TPZSolutionMatrix_*>::NElements((TPZVec<TPZSolutionMatrix_*> *)pTVar9);
          pTVar8 = (TPZSolutionMatrix *)(in_RDI + 0x38);
          TPZVec<TPZSolutionMatrix_*>::operator[]
                    ((TPZVec<TPZSolutionMatrix_*> *)pTVar9,(long)((int)iVar1 + -1));
          TPZSolutionMatrix::operator=(pTVar8,pTVar9);
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "TPZMGAnalysis::Solve no need for iterations normrhs = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,SVar10);
        poVar5 = std::operator<<(poVar5," normres = ");
        pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar11);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        iVar1 = TPZVec<TPZSolutionMatrix_*>::NElements
                          ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8));
        iVar7 = TPZVec<TPZCompMesh_*>::NElements((TPZVec<TPZCompMesh_*> *)(in_RDI + 0x488));
        if (iVar1 < iVar7) {
          operator_new(0x138);
          TPZSolutionMatrix::TPZSolutionMatrix(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          TPZStack<TPZSolutionMatrix_*,_10>::Push
                    ((TPZStack<TPZSolutionMatrix_*,_10> *)in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd68);
        }
        else {
          iVar1 = TPZVec<TPZSolutionMatrix_*>::NElements
                            ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8));
          TPZVec<TPZSolutionMatrix_*>::operator[]
                    ((TPZVec<TPZSolutionMatrix_*> *)(in_RDI + 0x4f8),(long)((int)iVar1 + -1));
          TPZSolutionMatrix::operator=
                    (in_stack_fffffffffffffd68,(TPZSolutionMatrix *)in_stack_fffffffffffffd60);
        }
      }
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c58d09);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c58d16);
    }
  }
  return;
}

Assistant:

void TPZMGAnalysis::SolveInternal()
{
  if(fMeshes.NElements() == 1) {
		TPZLinearAnalysis::Solve();
		if(fSolvers.NElements() == 0) {
			fSolvers.Push((TPZMatrixSolver<TVar> *) fSolver->Clone());
		}
		if(fPrecondition.NElements() == 0) {
			fPrecondition.Push(0);
		}
		if(fSolutions.NElements() == 0) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return;
	}
	int numeq = fCompMesh->NEquations();
	if(fRhs.Rows() != numeq ) return;
	int nsolvers = fSolvers.NElements();
	
	TPZFMatrix<TVar> residual(fRhs);
	TPZFMatrix<TVar> delu(numeq,1,0.);
	TPZMatrixSolver<TVar> *solve = dynamic_cast<TPZMatrixSolver<TVar> *> (fSolvers[nsolvers-1]);
	if(fSolution.Rows() != numeq) {
		fSolution.Redim(numeq,1);
	} else {
		solve->Matrix()->Residual(fSolution,fRhs,residual);
	}
	
	REAL normrhs = Norm(fRhs);
	REAL normres  = Norm(residual);
	if(normrhs*1.e-6 >= normres) {
		cout << "TPZMGAnalysis::Solve no need for iterations normrhs = " << normrhs << " normres = " << normres << endl;
		if(fSolutions.NElements() < fMeshes.NElements()) {
			fSolutions.Push(new TPZSolutionMatrix(fSolution));
		} else {
			int nsol = fSolutions.NElements();
			*(fSolutions[nsol-1]) = fSolution;
		}
		return ;
	}
	
	TPZStepSolver<TVar> *stepsolve = dynamic_cast<TPZStepSolver<TVar> *> (solve);
	if(stepsolve) stepsolve->SetTolerance(1.e-6*normrhs/normres);
	cout << "TPZMGAnalysis::Run res : " << Norm(residual) << " neq " << numeq << endl;
	solve->Solve(residual, delu);
	TPZFMatrix<TVar> &mysol = fSolution;
	mysol += delu;

	fCompMesh->LoadSolution(fSolution);
	if(fSolutions.NElements() < fMeshes.NElements()) {
		fSolutions.Push(new TPZSolutionMatrix(fSolution));
	} else {
		int nsol = fSolutions.NElements();
		*(fSolutions[nsol-1]) = fSolution;
	}
}